

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_def.c
# Opt level: O1

int Connect_Fields(FORM *form,FIELD **fields)

{
  short sVar1;
  FIELD *pFVar2;
  FIELD *pFVar3;
  _PAGE *p_Var4;
  int *piVar5;
  _PAGE *p_Var6;
  short sVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  FIELD *pFVar13;
  uint uVar14;
  FIELD *pFVar15;
  ulong uVar16;
  bool bVar17;
  
  form->field = fields;
  form->maxfield = 0;
  form->maxpage = 0;
  if (fields != (FIELD **)0x0) {
    pFVar3 = *fields;
    if (pFVar3 == (FIELD *)0x0) {
      iVar8 = 0;
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      iVar8 = 0;
      do {
        if (pFVar3->form != (formnode *)0x0) {
          iVar8 = -4;
          goto LAB_00458ffd;
        }
        if ((uVar16 == 0) || ((pFVar3->status & 4) != 0)) {
          iVar8 = iVar8 + 1;
        }
        pFVar3->form = form;
        pFVar3 = fields[uVar16 + 1];
        uVar16 = uVar16 + 1;
      } while (pFVar3 != (FIELD *)0x0);
    }
    if ((int)uVar16 == 0) {
      iVar8 = -2;
      goto LAB_00458ffd;
    }
    p_Var4 = (_PAGE *)malloc((long)iVar8 << 3);
    if (p_Var4 == (_PAGE *)0x0) {
      iVar8 = -1;
      goto LAB_00458ffd;
    }
    form->page = p_Var4;
    uVar9 = (uint)(ushort)form->rows;
    uVar12 = (uint)(ushort)form->cols;
    uVar10 = 0;
    p_Var6 = p_Var4;
    do {
      if (uVar10 == 0) {
        p_Var6->pmin = 0;
      }
      else if ((fields[uVar10]->status & 4) != 0) {
        p_Var6->pmax = (short)uVar10 + -1;
        p_Var6[1].pmin = (short)uVar10;
        p_Var6 = p_Var6 + 1;
      }
      pFVar3 = fields[uVar10];
      uVar14 = (int)pFVar3->rows + (int)pFVar3->frow;
      sVar7 = pFVar3->fcol;
      sVar1 = pFVar3->cols;
      if ((int)(short)uVar9 < (int)uVar14) {
        form->rows = (short)uVar14;
        uVar9 = uVar14;
      }
      uVar14 = (int)sVar1 + (int)sVar7;
      if ((int)(short)uVar12 < (int)uVar14) {
        form->cols = (short)uVar14;
        uVar12 = uVar14;
      }
      uVar10 = uVar10 + 1;
    } while ((uVar16 & 0xffffffff) != uVar10);
    p_Var6->pmax = (short)uVar16 + -1;
    form->maxfield = (short)uVar16;
    sVar7 = (short)iVar8;
    form->maxpage = sVar7;
    if (0 < sVar7) {
      uVar16 = 0;
      do {
        sVar1 = p_Var4[uVar16].pmax;
        pFVar3 = (FIELD *)0x0;
        lVar11 = (long)p_Var4[uVar16].pmin;
        do {
          pFVar2 = fields[lVar11];
          pFVar2->index = (short)lVar11;
          pFVar2->page = (short)uVar16;
          if (pFVar2 == (FIELD *)0x0) {
            __assert_fail("newfield != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CursesDialog/form/frm_def.c"
                          ,0x51,"FIELD *Insert_Field_By_Position(FIELD *, FIELD *)");
          }
          if (pFVar3 == (FIELD *)0x0) {
            pFVar2->sprev = pFVar2;
            pFVar2->snext = pFVar2;
            pFVar3 = pFVar2;
          }
          else {
            pFVar13 = pFVar3;
            do {
              if ((pFVar2->frow <= pFVar13->frow) &&
                 ((pFVar15 = pFVar3, pFVar13->frow != pFVar2->frow ||
                  (pFVar2->fcol <= pFVar13->fcol)))) goto LAB_00458f94;
              pFVar13 = pFVar13->snext;
            } while (pFVar13 != pFVar3);
            pFVar15 = (FIELD *)0x0;
LAB_00458f94:
            pFVar2->snext = pFVar13;
            pFVar2->sprev = pFVar13->sprev;
            pFVar13->sprev = pFVar2;
            pFVar2->sprev->snext = pFVar2;
            if (pFVar13 == pFVar15) {
              pFVar3 = pFVar2;
            }
          }
          bVar17 = lVar11 != sVar1;
          lVar11 = lVar11 + 1;
        } while (bVar17);
        p_Var4[uVar16].smin = pFVar3->index;
        p_Var4[uVar16].smax = pFVar3->sprev->index;
        uVar16 = uVar16 + 1;
      } while (uVar16 != (uint)(int)sVar7);
    }
  }
  iVar8 = 0;
LAB_00458ffd:
  piVar5 = __errno_location();
  *piVar5 = iVar8;
  return iVar8;
}

Assistant:

static int Connect_Fields(FORM  * form, FIELD ** fields)
{
  int field_cnt, j;
  int page_nr;
  int maximum_row_in_field, maximum_col_in_field;
  _PAGE *pg;
  
  assert(form != 0);

  form->field    = fields;
  form->maxfield = 0;
  form->maxpage  = 0;

  if (!fields)
    RETURN(E_OK);
  
  page_nr = 0;
  /* store formpointer in fields and count pages */
  for(field_cnt=0;fields[field_cnt];field_cnt++)
    {
      if (fields[field_cnt]->form) 
	RETURN(E_CONNECTED);
      if ( field_cnt==0 || 
	  (fields[field_cnt]->status & _NEWPAGE)) 
	page_nr++;
      fields[field_cnt]->form = form;
    }	
  if (field_cnt==0)
    RETURN(E_BAD_ARGUMENT);
  
  /* allocate page structures */
  if ( (pg = (_PAGE *)malloc(page_nr * sizeof(_PAGE))) != (_PAGE *)0 )
    {
      form->page = pg;
    }
  else
    RETURN(E_SYSTEM_ERROR);
  
  /* Cycle through fields and calculate page boundaries as well as
     size of the form */
  for(j=0;j<field_cnt;j++)
    {
      if (j==0) 
	pg->pmin = j;
      else
	{
	  if (fields[j]->status & _NEWPAGE)
	    {
	      pg->pmax = j-1;
	      pg++;
	      pg->pmin = j;
	    }
	}
      
      maximum_row_in_field = fields[j]->frow + fields[j]->rows;
      maximum_col_in_field = fields[j]->fcol + fields[j]->cols;
      
      if (form->rows < maximum_row_in_field) 
	form->rows = maximum_row_in_field;
      if (form->cols < maximum_col_in_field) 
	form->cols = maximum_col_in_field;
    }
  
  pg->pmax       = field_cnt-1;
  form->maxfield = field_cnt;
  form->maxpage  = page_nr; 
  
  /* Sort fields on form pages */
  for(page_nr = 0;page_nr < form->maxpage; page_nr++)
    {
      FIELD *fld = (FIELD *)0;
      for(j = form->page[page_nr].pmin;j <= form->page[page_nr].pmax;j++)
	{
	  fields[j]->index = j;
	  fields[j]->page  = page_nr;
	  fld = Insert_Field_By_Position(fields[j],fld);
	}
      form->page[page_nr].smin = fld->index;
      form->page[page_nr].smax = fld->sprev->index;
    }
  RETURN(E_OK);
}